

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O0

void test_hash(ssh_hashalg *halg)

{
  void *ptr;
  uchar *out;
  size_t sVar1;
  ulong local_38;
  size_t i;
  uint8_t *hash;
  uint8_t *data;
  size_t datalen;
  ssh_hash *h;
  ssh_hashalg *halg_local;
  
  datalen = (size_t)ssh_hash_new(halg);
  if ((ssh_hash *)datalen == (ssh_hash *)0x0) {
    test_skipped = true;
  }
  else {
    ptr = safemalloc(0x100,1,0);
    out = (uchar *)safemalloc(halg->hlen,1,0);
    local_38 = 0;
    while( true ) {
      sVar1 = (*looplimit)(0x10);
      if (sVar1 <= local_38) break;
      random_read(ptr,0x100);
      log_start();
      BinarySink_put_data(*(BinarySink **)(datalen + 8),ptr,0x100);
      ssh_hash_final((ssh_hash *)datalen,out);
      log_end();
      datalen = (size_t)ssh_hash_new(halg);
      local_38 = local_38 + 1;
    }
    safefree(ptr);
    safefree(out);
    ssh_hash_free((ssh_hash *)datalen);
  }
  return;
}

Assistant:

static void test_hash(const ssh_hashalg *halg)
{
    ssh_hash *h = ssh_hash_new(halg);
    if (!h) {
        test_skipped = true;
        return;
    }

    size_t datalen = 256;
    uint8_t *data = snewn(datalen, uint8_t);
    uint8_t *hash = snewn(halg->hlen, uint8_t);

    for (size_t i = 0; i < looplimit(16); i++) {
        random_read(data, datalen);

        log_start();
        put_data(h, data, datalen);
        ssh_hash_final(h, hash);
        log_end();

        h = ssh_hash_new(halg);
    }

    sfree(data);
    sfree(hash);
    ssh_hash_free(h);
}